

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encodeframe.c
# Opt level: O1

void av1_encode_frame(AV1_COMP *cpi)

{
  uint uVar1;
  STATS_BUFFER_CTX *pSVar2;
  uint uVar3;
  uint uVar4;
  int total_valid_refs;
  uint uVar5;
  uint uVar6;
  int iVar7;
  long lVar8;
  uint8_t *puVar9;
  FIRSTPASS_STATS *pFVar10;
  int iVar11;
  uint uVar12;
  int iVar13;
  int iVar14;
  ulong uVar15;
  FIRSTPASS_STATS *pFVar16;
  byte bVar17;
  
  (cpi->common).features.reduced_tx_set_used = (cpi->oxcf).txfm_cfg.reduced_tx_type_set;
  if ((((cpi->common).seg.enabled != '\0') && ((cpi->common).seg.update_map != '\0')) &&
     (iVar14 = (cpi->common).mi_params.mi_rows, 0 < iVar14)) {
    uVar1 = (cpi->common).mi_params.mi_cols;
    iVar7 = (cpi->common).seg.last_active_segid;
    puVar9 = (cpi->enc_seg).map;
    iVar11 = 0;
    do {
      if (0 < (int)uVar1) {
        uVar15 = 0;
        do {
          bVar17 = puVar9[uVar15];
          if (iVar7 <= (int)(uint)puVar9[uVar15]) {
            bVar17 = (byte)iVar7;
          }
          puVar9[uVar15] = bVar17;
          uVar15 = uVar15 + 1;
        } while (uVar1 != uVar15);
      }
      puVar9 = puVar9 + (int)uVar1;
      iVar11 = iVar11 + 1;
    } while (iVar11 != iVar14);
  }
  av1_setup_frame_buf_refs(&cpi->common);
  uVar1 = (cpi->common).current_frame.display_order_hint;
  uVar4 = cpi->ref_frame_flags;
  uVar5 = 0;
  lVar8 = 1;
  do {
    uVar5 = (uVar5 + 1) - (uint)((""[lVar8] & uVar4) == 0);
    lVar8 = lVar8 + 1;
  } while (lVar8 != 8);
  uVar6 = (cpi->oxcf).ref_frm_cfg.max_reference_frames;
  iVar14 = (cpi->sf).inter_sf.selective_ref_frame;
  uVar12 = 7;
  if (2 < iVar14) {
    uVar12 = 4;
    if ((iVar14 < 6) && (uVar12 = 6, (uVar4 & 2) != 0 && iVar14 == 5)) {
      uVar12 = ((cpi->common).cur_frame)->ref_display_order_hint[1] - uVar1;
      uVar3 = -uVar12;
      if (0 < (int)uVar12) {
        uVar3 = uVar12;
      }
      uVar12 = 5;
      if ((uVar3 < 3) && (uVar12 = 6, AOM_RC_FIRST_PASS < (cpi->oxcf).pass)) {
        pSVar2 = (cpi->ppi->twopass).stats_buf_ctx;
        pFVar10 = pSVar2->stats_in_start + uVar1;
        pFVar16 = (FIRSTPASS_STATS *)0x0;
        if (pFVar10 <= pSVar2->stats_in_end) {
          pFVar16 = pFVar10;
        }
        uVar12 = (100.0 < pFVar16->coded_error || pFVar16->coded_error == 100.0) + 5;
      }
    }
  }
  if (uVar12 < uVar6) {
    uVar6 = uVar12;
  }
  if (uVar6 < uVar5) {
    uVar15 = 0;
    do {
      if ((uVar4 & ""["\x03\x02\x06\x05"[uVar15]]) != 0) {
        bVar17 = "\x03\x02\x06\x05"[uVar15] - 2;
        if ((bVar17 < 5) && ((0x1bU >> (bVar17 & 0x1f) & 1) != 0)) {
          uVar4 = uVar4 & (&DAT_004db208)[bVar17];
          cpi->ref_frame_flags = uVar4;
        }
        uVar5 = uVar5 - 1;
      }
    } while ((uVar15 < 3) && (uVar15 = uVar15 + 1, (int)uVar6 < (int)uVar5));
  }
  uVar1 = cpi->ref_frame_flags;
  (cpi->ref_frame_dist_info).nearest_past_ref = -1;
  (cpi->ref_frame_dist_info).nearest_future_ref = -1;
  iVar14 = 0x7fffffff;
  lVar8 = 0;
  iVar7 = 0x7fffffff;
  do {
    (cpi->ref_frame_dist_info).ref_relative_dist[lVar8] = 0;
    if ((uVar1 & ""[lVar8 + 1]) != 0) {
      iVar13 = ((cpi->common).cur_frame)->ref_display_order_hint[lVar8] -
               (cpi->common).current_frame.display_order_hint;
      (cpi->ref_frame_dist_info).ref_relative_dist[lVar8] = iVar13;
      iVar11 = -iVar13;
      if (0 < iVar13) {
        iVar11 = iVar13;
      }
      if ((iVar13 < 0) && (iVar11 < iVar7)) {
        (cpi->ref_frame_dist_info).nearest_past_ref = (char)lVar8 + '\x01';
        iVar7 = iVar11;
      }
      if (0 < iVar13 && iVar13 < iVar14) {
        (cpi->ref_frame_dist_info).nearest_future_ref = (char)lVar8 + '\x01';
        iVar14 = iVar13;
      }
    }
    lVar8 = lVar8 + 1;
  } while (lVar8 != 7);
  av1_setup_frame_sign_bias(&cpi->common);
  (cpi->td).rd_counts.newmv_or_intra_blocks = 0;
  cpi->palette_pixel_num = 0;
  if (((cpi->sf).hl_sf.frame_parameter_update == 0) && ((cpi->sf).rt_sf.use_comp_ref_nonrd == 0)) {
    if ((cpi->common).current_frame.reference_mode == '\x02') {
      (cpi->common).current_frame.reference_mode = '\0';
    }
    encode_frame_internal(cpi);
    return;
  }
  (cpi->common).current_frame.reference_mode =
       (((cpi->common).current_frame.frame_type & 0xfd) != 0) * '\x02';
  (cpi->common).features.interp_filter = ((cpi->common).tiles.large_scale == 0) << 2;
  (cpi->common).features.switchable_motion_mode =
       (bool)((cpi->oxcf).motion_mode_cfg.enable_obmc | (cpi->common).features.allow_warped_motion);
  (cpi->td).rd_counts.compound_ref_used_flag = 0;
  (cpi->td).rd_counts.skip_mode_used_flag = 0;
  encode_frame_internal(cpi);
  if (((cpi->common).current_frame.reference_mode == '\x02') &&
     ((cpi->td).rd_counts.compound_ref_used_flag == 0)) {
    (cpi->common).current_frame.reference_mode = '\0';
  }
  if ((((cpi->common).current_frame.frame_type & 0xfd) == 0) ||
     ((cpi->common).current_frame.reference_mode == '\0')) {
    (cpi->common).current_frame.skip_mode_info.skip_mode_allowed = 0;
    (cpi->common).current_frame.skip_mode_info.skip_mode_flag = 0;
  }
  if (((cpi->common).current_frame.skip_mode_info.skip_mode_flag != 0) &&
     ((cpi->td).rd_counts.skip_mode_used_flag == 0)) {
    (cpi->common).current_frame.skip_mode_info.skip_mode_flag = 0;
  }
  if ((((cpi->common).tiles.large_scale == 0) && ((cpi->common).features.tx_mode == '\x02')) &&
     ((cpi->td).mb.txfm_search_info.txb_split_count == 0)) {
    (cpi->common).features.tx_mode = '\x01';
  }
  return;
}

Assistant:

void av1_encode_frame(AV1_COMP *cpi) {
  AV1_COMMON *const cm = &cpi->common;
  CurrentFrame *const current_frame = &cm->current_frame;
  FeatureFlags *const features = &cm->features;
  RD_COUNTS *const rdc = &cpi->td.rd_counts;
  const AV1EncoderConfig *const oxcf = &cpi->oxcf;
  // Indicates whether or not to use a default reduced set for ext-tx
  // rather than the potential full set of 16 transforms
  features->reduced_tx_set_used = oxcf->txfm_cfg.reduced_tx_type_set;

  // Make sure segment_id is no larger than last_active_segid.
  if (cm->seg.enabled && cm->seg.update_map) {
    const int mi_rows = cm->mi_params.mi_rows;
    const int mi_cols = cm->mi_params.mi_cols;
    const int last_active_segid = cm->seg.last_active_segid;
    uint8_t *map = cpi->enc_seg.map;
    for (int mi_row = 0; mi_row < mi_rows; ++mi_row) {
      for (int mi_col = 0; mi_col < mi_cols; ++mi_col) {
        map[mi_col] = AOMMIN(map[mi_col], last_active_segid);
      }
      map += mi_cols;
    }
  }

  av1_setup_frame_buf_refs(cm);
  enforce_max_ref_frames(cpi, &cpi->ref_frame_flags,
                         cm->cur_frame->ref_display_order_hint,
                         cm->current_frame.display_order_hint);
  set_rel_frame_dist(&cpi->common, &cpi->ref_frame_dist_info,
                     cpi->ref_frame_flags);
  av1_setup_frame_sign_bias(cm);

  // If global motion is enabled, then every buffer which is used as either
  // a source or a ref frame should have an image pyramid allocated.
  // Check here so that issues can be caught early in debug mode
#if !defined(NDEBUG) && !CONFIG_REALTIME_ONLY
  if (cpi->alloc_pyramid) {
    assert(cpi->source->y_pyramid);
    for (int ref_frame = LAST_FRAME; ref_frame <= ALTREF_FRAME; ++ref_frame) {
      const RefCntBuffer *const buf = get_ref_frame_buf(cm, ref_frame);
      if (buf != NULL) {
        assert(buf->buf.y_pyramid);
      }
    }
  }
#endif  // !defined(NDEBUG) && !CONFIG_REALTIME_ONLY

#if CONFIG_MISMATCH_DEBUG
  mismatch_reset_frame(av1_num_planes(cm));
#endif

  rdc->newmv_or_intra_blocks = 0;
  cpi->palette_pixel_num = 0;

  if (cpi->sf.hl_sf.frame_parameter_update ||
      cpi->sf.rt_sf.use_comp_ref_nonrd) {
    if (frame_is_intra_only(cm))
      current_frame->reference_mode = SINGLE_REFERENCE;
    else
      current_frame->reference_mode = REFERENCE_MODE_SELECT;

    features->interp_filter = SWITCHABLE;
    if (cm->tiles.large_scale) features->interp_filter = EIGHTTAP_REGULAR;

    features->switchable_motion_mode = is_switchable_motion_mode_allowed(
        features->allow_warped_motion, oxcf->motion_mode_cfg.enable_obmc);

    rdc->compound_ref_used_flag = 0;
    rdc->skip_mode_used_flag = 0;

    encode_frame_internal(cpi);

    if (current_frame->reference_mode == REFERENCE_MODE_SELECT) {
      // Use a flag that includes 4x4 blocks
      if (rdc->compound_ref_used_flag == 0) {
        current_frame->reference_mode = SINGLE_REFERENCE;
#if CONFIG_ENTROPY_STATS
        av1_zero(cpi->td.counts->comp_inter);
#endif  // CONFIG_ENTROPY_STATS
      }
    }
    // Re-check on the skip mode status as reference mode may have been
    // changed.
    SkipModeInfo *const skip_mode_info = &current_frame->skip_mode_info;
    if (frame_is_intra_only(cm) ||
        current_frame->reference_mode == SINGLE_REFERENCE) {
      skip_mode_info->skip_mode_allowed = 0;
      skip_mode_info->skip_mode_flag = 0;
    }
    if (skip_mode_info->skip_mode_flag && rdc->skip_mode_used_flag == 0)
      skip_mode_info->skip_mode_flag = 0;

    if (!cm->tiles.large_scale) {
      if (features->tx_mode == TX_MODE_SELECT &&
          cpi->td.mb.txfm_search_info.txb_split_count == 0)
        features->tx_mode = TX_MODE_LARGEST;
    }
  } else {
    // This is needed if real-time speed setting is changed on the fly
    // from one using compound prediction to one using single reference.
    if (current_frame->reference_mode == REFERENCE_MODE_SELECT)
      current_frame->reference_mode = SINGLE_REFERENCE;
    encode_frame_internal(cpi);
  }
}